

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int CreatePlaySoundFunc(VMFunctionBuilder *buildit,int value1,int value2)

{
  int opc;
  int opc_00;
  int value;
  FSoundID *this;
  float local_24;
  int attenreg;
  int float1;
  int value2_local;
  int value1_local;
  VMFunctionBuilder *buildit_local;
  
  opc = VMFunctionBuilder::GetConstantFloat(buildit,1.0);
  local_24 = 0.0;
  if (value2 == 0) {
    local_24 = 1.0;
  }
  opc_00 = VMFunctionBuilder::GetConstantFloat(buildit,(double)local_24);
  this = TArray<FSoundID,_FSoundID>::operator[](&SoundMap,(long)(value1 + -1));
  value = FSoundID::operator_cast_to_int(this);
  VMFunctionBuilder::EmitParamInt(buildit,value);
  VMFunctionBuilder::Emit(buildit,0x3a,4);
  VMFunctionBuilder::Emit(buildit,0x39,0,5,opc);
  VMFunctionBuilder::Emit(buildit,0x3a,0);
  VMFunctionBuilder::Emit(buildit,0x39,0,5,opc_00);
  return 5;
}

Assistant:

static int CreatePlaySoundFunc(VMFunctionBuilder &buildit, int value1, int value2)
{ // A_PlaySound
	int float1 = buildit.GetConstantFloat(1);
	int attenreg = buildit.GetConstantFloat(value2 ? ATTN_NONE : ATTN_NORM);

	buildit.EmitParamInt(SoundMap[value1-1]);						// soundid
	buildit.Emit(OP_PARAMI, CHAN_BODY);								// channel
	buildit.Emit(OP_PARAM, 0, REGT_FLOAT | REGT_KONST, float1);		// volume
	buildit.Emit(OP_PARAMI, false);									// looping
	buildit.Emit(OP_PARAM, 0, REGT_FLOAT | REGT_KONST, attenreg);	// attenuation
	return 5;
}